

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Performance::InvalidShaderCompilerOperCase::~InvalidShaderCompilerOperCase
          (InvalidShaderCompilerOperCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_InvalidShaderCompilerCase).super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__InvalidShaderCompilerOperCase_02173518;
  pcVar2 = (this->m_oper)._M_dataplus._M_p;
  paVar1 = &(this->m_oper).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

InvalidShaderCompilerOperCase::~InvalidShaderCompilerOperCase (void)
{
}